

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

MPP_RET mpp_enc_refs_get_cpb(MppEncRefs refs,EncCpbStatus *status)

{
  EncFrmStatus *frm;
  byte *pbVar1;
  EncVirtualCpb *cpb;
  EncFrmStatus *frm_00;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  RK_S32 RVar5;
  ulong uVar6;
  EncFrmStatus *frm_01;
  EncFrmStatus EVar7;
  ulong uVar8;
  int iVar9;
  MppEncRefStFrmCfg *st_cfg;
  char *pcVar10;
  MPP_RET MVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  RefsCnt *lt_cfg;
  
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_get_cpb");
    MVar11 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb",refs);
    }
    lVar2 = *(long *)((long)refs + 8);
    uVar3 = (status->curr).val;
    uVar12 = *refs >> 2 & 1;
    iVar14 = *(int *)((long)refs + 0x30);
    if ((iVar14 != 0) && (iVar14 <= *(int *)((long)refs + 0x5d4))) {
      if (*(int *)((long)refs + 0x34) == 0) {
        uVar12 = 1;
      }
      else {
        *(int *)((long)refs + 0x5d8) = *(int *)((long)refs + 0x5d4) / iVar14 + 1;
      }
    }
    if ((*(uint *)((long)refs + 0x10) & 1) != 0) {
      *(uint *)((long)refs + 0x10) = *(uint *)((long)refs + 0x10) & 0xfffffffe;
      *(undefined4 *)((long)refs + 0x5d8) = 0;
      uVar12 = 1;
    }
    frm = &status->curr;
    if (uVar12 == 0) {
      if ((*refs & 1) != 0) {
        *(undefined8 *)((long)refs + 0x5dc) = 0;
      }
    }
    else {
      *(undefined4 *)((long)refs + 0x5d4) = 0;
      lVar15 = 0;
      memset((void *)((long)refs + 0x60),0,0x300);
      *(undefined8 *)((long)refs + 0x5a0) = 0;
      *(undefined8 *)((long)refs + 0x5a8) = 0;
      *(undefined8 *)((long)refs + 0x5b0) = 0;
      *(undefined8 *)((long)refs + 0x5b8) = 0;
      *(undefined8 *)((long)refs + 0x5c0) = 0;
      *(undefined8 *)((long)refs + 0x5c8) = 0;
      *(int *)((long)refs + 0x5d8) = *(int *)((long)refs + 0x5d8) + 1;
      *(undefined8 *)((long)refs + 0x5dc) = 0;
      do {
        *(undefined4 *)((long)refs + lVar15 + 0x364) = *(undefined4 *)((long)refs + lVar15 + 0x360);
        *(undefined8 *)((long)refs + lVar15 + 0x36c) = 0;
        lVar15 = lVar15 + 0x24;
      } while (lVar15 != 0x240);
    }
    *(undefined4 *)refs = 0;
    *(int *)((long)refs + 0x5d0) = *(int *)((long)refs + 0x5d0) + 1;
    iVar14 = *(int *)((long)refs + 0x5d4);
    uVar12 = (uint)(1 < *(int *)(lVar2 + 0x20));
    if ((int)*(uint *)((long)refs + 0x5dc) < *(int *)(lVar2 + 0x20)) {
      uVar12 = *(uint *)((long)refs + 0x5dc);
    }
    *(uint *)((long)refs + 0x5dc) = uVar12;
    st_cfg = (MppEncRefStFrmCfg *)((long)(int)uVar12 * 0x14 + *(long *)(lVar2 + 0x30));
    *(int *)((long)refs + 0x5d4) = iVar14 + 1;
    set_st_cfg_to_frm(frm,iVar14,st_cfg);
    set_frm_refresh_flag(frm,(MppEncRefsImpl *)refs);
    if (0 < *(int *)(lVar2 + 0x1c)) {
      lt_cfg = (RefsCnt *)((long)refs + 0x360);
      iVar14 = 0;
      bVar4 = false;
      do {
        if (lt_cfg->delay_cnt == 0) {
          if (bVar4) {
LAB_0014d66b:
            bVar4 = true;
          }
          else {
            bVar4 = false;
            if (lt_cfg->cnt == 0) {
              set_lt_cfg_to_frm(frm,lt_cfg);
              goto LAB_0014d66b;
            }
          }
          iVar9 = lt_cfg->cnt + 1;
          lt_cfg->cnt = iVar9;
          if (lt_cfg->len <= iVar9) {
            if (lt_cfg->len == 0) {
              lt_cfg->cnt = 1;
              lt_cfg->idx = 1;
            }
            else {
              lt_cfg->cnt = 0;
              lt_cfg->idx = lt_cfg->idx + 1;
            }
          }
        }
        else {
          lt_cfg->delay_cnt = lt_cfg->delay_cnt + -1;
        }
        iVar14 = iVar14 + 1;
        lt_cfg = lt_cfg + 1;
      } while (iVar14 < *(int *)(lVar2 + 0x1c));
    }
    if ((*(byte *)((long)refs + 0x10) & 4) != 0) {
      uVar8 = frm->val;
      frm->val = uVar8 & 0xffffffffffffff3f | 0x80;
      uVar12 = *(uint *)((long)refs + 0x20) & 0xf;
      uVar6 = uVar8 & 0xfffffffffffff03f | 0x80;
      frm->val = uVar6 + (uVar12 << 8);
      if (((uVar8 & 0x20) != 0) && (uVar12 != 0)) {
        frm->val = uVar6;
        _mpp_log_l(2,"mpp_enc_refs","can not set IDR to ltr with non-zero index\n",
                   "mpp_enc_refs_get_cpb");
      }
      pbVar1 = (byte *)((long)&status->curr + 1);
      *pbVar1 = *pbVar1 & 0xf;
      *(undefined8 *)((long)refs + 0x5dc) = 0;
      *(byte *)((long)refs + 0x10) = *(byte *)((long)refs + 0x10) & 0xfb;
    }
    if ((*(byte *)((long)refs + 0x10) & 8) != 0) {
      uVar12 = *(uint *)((long)refs + 0x24);
      if (((int)uVar12 < *(int *)(lVar2 + 0x24)) && ((frm->val & 0xa0) == 0)) {
        frm->val = frm->val & 0xffffffffffff0f5f | (ulong)((uVar12 & 0xf) << 0xc);
      }
      else {
        pcVar10 = "LTR";
        if (-1 < (char)frm->val) {
          pcVar10 = "st";
        }
        pcVar13 = "IDR";
        if ((frm->val & 0x20) == 0) {
          pcVar13 = pcVar10;
        }
        _mpp_log_l(2,"mpp_enc_refs","Invalid temporal_id %d, frm is %s\n","mpp_enc_refs_get_cpb",
                   (ulong)uVar12,pcVar13);
      }
      *(byte *)((long)refs + 0x10) = *(byte *)((long)refs + 0x10) & 0xf7;
    }
    if ((*(byte *)((long)refs + 0x10) & 0x10) != 0) {
      uVar8 = frm->val;
      uVar6 = (ulong)((*(uint *)((long)refs + 0x28) & 0x3f) << 0x10);
      frm->val = uVar8 & 0xffffffffffc0ffff | uVar6;
      frm->val = uVar8 & 0xffffffffc000ffff | uVar6 |
                 (ulong)((*(uint *)((long)refs + 0x2c) & 0xff) << 0x16);
      *(byte *)((long)refs + 0x10) = *(byte *)((long)refs + 0x10) & 0xef;
    }
    if ((*(byte *)((long)refs + 0x10) & 0x40) != 0) {
      *(byte *)frm = *(byte *)frm | 0x40;
      *(byte *)((long)refs + 0x10) = *(byte *)((long)refs + 0x10) & 0xbf;
    }
    if ((*(byte *)((long)refs + 0x10) & 0x20) != 0) {
      pbVar1 = (byte *)((long)&status->curr + 4);
      *pbVar1 = *pbVar1 | 0x20;
      *(byte *)((long)refs + 0x10) = *(byte *)((long)refs + 0x10) & 0xdf;
    }
    uVar8 = 2;
    if ((frm->val & 0x40) == 0) {
      uVar8 = (ulong)((uint)(*(int *)((long)refs + 0x30) == 1) * 2);
    }
    cpb = (EncVirtualCpb *)((long)refs + 0x40);
    frm->val = frm->val & 0xfffffffffffffffd | uVar8;
    iVar14 = *(int *)((long)refs + 0x5e0);
    *(int *)((long)refs + 0x5e0) = iVar14 + 1;
    if (st_cfg->repeat <= iVar14) {
      *(undefined4 *)((long)refs + 0x5e0) = 0;
      *(int *)((long)refs + 0x5dc) = *(int *)((long)refs + 0x5dc) + 1;
    }
    frm_00 = &status->refr;
    frm_01 = get_ref_from_cpb(cpb,frm);
    if (frm_01 == (EncFrmStatus *)0x0) {
      EVar7.val = 0;
    }
    else {
      RVar5 = check_ref_cpb_pos(cpb,frm_01);
      if ((RVar5 < 0) &&
         (_mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"cpb_idx >= 0",
                     "mpp_enc_refs_get_cpb",0x3a7), (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      *(EncFrmStatus *)((long)refs + 0x5a0) = *frm_00;
      EVar7 = *frm_01;
    }
    *frm_00 = EVar7;
    if ((uVar3 & 4) != 0) {
      *(byte *)frm = *(byte *)frm | 8;
    }
    if (((byte)enc_refs_debug & 4) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm status:\n","mpp_enc_refs_get_cpb");
      _dump_frm(frm,"mpp_enc_refs_get_cpb",0x3b3);
      _mpp_log_l(4,"mpp_enc_refs","ref status:\n","mpp_enc_refs_get_cpb");
      _dump_frm(frm_00,"mpp_enc_refs_get_cpb",0x3b5);
    }
    status->init[6].val = 0;
    status->init[7].val = 0;
    status->init[4].val = 0;
    status->init[5].val = 0;
    status->init[2].val = 0;
    status->init[3].val = 0;
    status->init[0].val = 0;
    status->init[1].val = 0;
    save_cpb_status(cpb,status->init);
    store_ref_to_cpb(cpb,frm);
    status->final[6].val = 0;
    status->final[7].val = 0;
    status->final[4].val = 0;
    status->final[5].val = 0;
    status->final[2].val = 0;
    status->final[3].val = 0;
    status->final[0].val = 0;
    status->final[1].val = 0;
    save_cpb_status(cpb,status->final);
    MVar11 = MPP_OK;
    if (((byte)enc_refs_debug & 1) != 0) {
      MVar11 = MPP_OK;
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb",refs);
    }
  }
  return MVar11;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb(MppEncRefs refs, EncCpbStatus *status)
{
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    MppEncRefCfgImpl *cfg = p->ref_cfg;
    EncVirtualCpb *cpb = &p->cpb;
    MppEncRefStFrmCfg *st_cfg = NULL;
    MppEncRefFrmUsrCfg *usr_cfg = &p->usr_cfg;
    EncFrmStatus *frm = &status->curr;
    EncFrmStatus *ref = &status->refr;
    RefsCnt *lt_cfg = cpb->lt_cnter;
    RK_S32 set_to_lt = 0;
    RK_S32 cleanup_cpb = 0;
    RK_S32 prev_frm_is_pass1 = frm->save_pass1;
    RK_S32 i;

    /* step 1. check igop from cfg_set and force idr for usr_cfg */
    if (p->changed & ENC_REFS_IGOP_CHANGED)
        cleanup_cpb = 1;

    if (p->igop && (cpb->seq_idx >= p->igop)) {
        if (p->refresh_length) {
            p->cpb.seq_cnt = cpb->seq_idx / p->igop + 1;
        } else
            cleanup_cpb = 1;
    }

    if (usr_cfg->force_flag & ENC_FORCE_IDR) {
        usr_cfg->force_flag &= (~ENC_FORCE_IDR);
        cleanup_cpb = 1;
        p->cpb.seq_cnt = 0;
    }

    if (cleanup_cpb) {
        /* update seq_idx for igop loop and force idr */
        cleanup_cpb_refs(cpb);
    } else if (p->changed & ENC_REFS_REF_CFG_CHANGED) {
        cpb->st_cfg_pos = 0;
        cpb->st_cfg_repeat_pos = 0;
    }

    p->changed = 0;

    cpb->frm_idx++;
    cpb->st_cfg_pos = get_cpb_st_cfg_pos(cpb, cfg);
    st_cfg = &cfg->st_cfg[cpb->st_cfg_pos];
    /* step 2. updated by st_cfg */
    set_st_cfg_to_frm(frm, cpb->seq_idx++, st_cfg);
    set_frm_refresh_flag(frm, p);

    lt_cfg = p->cpb.lt_cnter;

    /* step 3. updated by lt_cfg */
    for (i = 0; i < cfg->lt_cfg_cnt; i++, lt_cfg++) {
        if (lt_cfg->delay_cnt) {
            lt_cfg->delay_cnt--;
            continue;
        }

        if (!set_to_lt) {
            if (!lt_cfg->cnt) {
                set_lt_cfg_to_frm(frm, lt_cfg);
                set_to_lt = 1;
            }
        }

        lt_cfg->cnt++;
        if (lt_cfg->cnt >= lt_cfg->len) {
            if (lt_cfg->len) {
                /* when there is loop len loop lt_cfg */
                lt_cfg->cnt = 0;
                lt_cfg->idx++;
            } else {
                /* else just set lt_cfg once */
                lt_cfg->cnt = 1;
                lt_cfg->idx = 1;
            }
        }
    }

    /* step 4. process force flags and force ref_mode */
    if (usr_cfg->force_flag & ENC_FORCE_LT_REF_IDX) {
        frm->is_non_ref = 0;
        frm->is_lt_ref = 1;
        frm->lt_idx = usr_cfg->force_lt_idx;
        if (frm->is_idr && frm->lt_idx) {
            frm->lt_idx = 0;
            mpp_err_f("can not set IDR to ltr with non-zero index\n");
        }
        /* lt_ref will be forced to tid 0 */
        frm->temporal_id = 0;

        /* reset st_cfg to next loop */
        cpb->st_cfg_repeat_pos = 0;
        cpb->st_cfg_pos = 0;
        usr_cfg->force_flag &= ~ENC_FORCE_LT_REF_IDX;
    }

    if (usr_cfg->force_flag & ENC_FORCE_TEMPORAL_ID) {
        if (usr_cfg->force_temporal_id >= cfg->max_tlayers ||
            frm->is_idr || frm->is_lt_ref)
            mpp_err_f("Invalid temporal_id %d, frm is %s\n", usr_cfg->force_temporal_id,
                      frm->is_idr ? "IDR" : (frm->is_lt_ref ? "LTR" : "st"));
        else
            frm->temporal_id = usr_cfg->force_temporal_id;

        usr_cfg->force_flag &= ~ENC_FORCE_TEMPORAL_ID;
    }

    if (usr_cfg->force_flag & ENC_FORCE_REF_MODE) {
        frm->ref_mode = usr_cfg->force_ref_mode;
        frm->ref_arg = usr_cfg->force_ref_arg;

        usr_cfg->force_flag &= ~ENC_FORCE_REF_MODE;
    }

    if (usr_cfg->force_flag & ENC_FORCE_PSKIP_NON_REF) {
        frm->is_non_ref = 1;

        usr_cfg->force_flag &= ~ENC_FORCE_PSKIP_NON_REF;
    }

    if (usr_cfg->force_flag & ENC_FORCE_PSKIP_IS_REF) {
        frm->force_pskip_is_ref = 1;

        usr_cfg->force_flag &= ~ENC_FORCE_PSKIP_IS_REF;
    }

    frm->non_recn = frm->is_non_ref || (p->igop == 1);

    /* update st_cfg for st_cfg loop */
    cpb->st_cfg_repeat_pos++;
    if (cpb->st_cfg_repeat_pos > st_cfg->repeat) {
        cpb->st_cfg_repeat_pos = 0;
        cpb->st_cfg_pos++;
    }

    /* step 4. try find ref by the ref_mode */
    EncFrmStatus *ref_found = get_ref_from_cpb(&p->cpb, frm);
    if (ref_found) {
        RK_S32 cpb_idx = check_ref_cpb_pos(&p->cpb, ref_found);

        mpp_assert(cpb_idx >= 0);
        cpb->list0[0].val = ref->val;
        ref->val = ref_found->val;
    } else
        ref->val = 0;

    /* step 5. check use previous pass one frame as input */
    if (prev_frm_is_pass1)
        frm->use_pass1 = 1;

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM) {
        mpp_log_f("frm status:\n");
        dump_frm(frm);
        mpp_log_f("ref status:\n");
        dump_frm(ref);
    }

    /* step 5. generate cpb init */
    memset(status->init, 0, sizeof(status->init));
    save_cpb_status(&p->cpb, status->init);
    // TODO: cpb_init must be the same to cpb_final

    /* step 6. store frame according to status */
    store_ref_to_cpb(&p->cpb, frm);

    /* step 7. generate cpb final */
    memset(status->final, 0, sizeof(status->final));
    save_cpb_status(&p->cpb, status->final);

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}